

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::StartMouseMovingWindowOrNode
               (ImGuiWindow *window,ImGuiDockNode *node,bool undock_floating_node)

{
  float fVar1;
  ImVec2 IVar2;
  bool bVar3;
  ImGuiContext *pIVar4;
  ImGuiDockNode *pIVar5;
  bool bVar6;
  ImGuiContext *g;
  ImGuiDockNode *pIVar7;
  uint uVar8;
  ImVec2 IVar9;
  float fVar10;
  
  pIVar4 = GImGui;
  bVar3 = true;
  if (((node != (ImGuiDockNode *)0x0) && (node->VisibleWindow != (ImGuiWindow *)0x0)) &&
     (pIVar5 = node, (node->VisibleWindow->Flags & 4) == 0)) {
    do {
      pIVar7 = pIVar5;
      pIVar5 = pIVar7->ParentNode;
    } while (pIVar7->ParentNode != (ImGuiDockNode *)0x0);
    if (((pIVar7->OnlyNodeWithWindows != node) || (pIVar7->CentralNode != (ImGuiDockNode *)0x0)) &&
       ((undock_floating_node || ((pIVar7->LocalFlags & 0x400) != 0)))) {
      bVar3 = false;
    }
  }
  if ((GImGui->IO).MouseDown[0] == true) {
    fVar1 = (GImGui->IO).MouseDragThreshold;
    fVar10 = fVar1 * 1.7;
    uVar8 = -(uint)(fVar10 < 0.0);
    fVar1 = (float)(~uVar8 & (uint)fVar10 | (uint)fVar1 & uVar8);
    bVar6 = fVar1 * fVar1 <= (GImGui->IO).MouseDragMaxDistanceSqr[0];
    if (bVar6 && !bVar3) {
      DockContextQueueUndockNode(GImGui,node);
      goto LAB_00151bf0;
    }
  }
  else {
    bVar6 = false;
  }
  if (!(bool)(bVar3 & ((GImGui->IO).MouseDownDuration[0] == 0.0 | bVar6))) {
    return;
  }
  if (GImGui->MovingWindow == window) {
    return;
  }
  StartMouseMovingWindow(window);
  node = (ImGuiDockNode *)window->RootWindow;
LAB_00151bf0:
  IVar2 = (pIVar4->IO).MouseClickedPos[0];
  IVar9.x = IVar2.x - (((ImGuiWindow *)node)->Pos).x;
  IVar9.y = IVar2.y - (((ImGuiWindow *)node)->Pos).y;
  pIVar4->ActiveIdClickOffset = IVar9;
  return;
}

Assistant:

void ImGui::StartMouseMovingWindowOrNode(ImGuiWindow* window, ImGuiDockNode* node, bool undock_floating_node)
{
    ImGuiContext& g = *GImGui;
    bool can_undock_node = false;
    if (node != NULL && node->VisibleWindow && (node->VisibleWindow->Flags & ImGuiWindowFlags_NoMove) == 0)
    {
        // Can undock if:
        // - part of a floating node hierarchy with more than one visible node (if only one is visible, we'll just move the whole hierarchy)
        // - part of a dockspace node hierarchy (trivia: undocking from a fixed/central node will create a new node and copy windows)
        ImGuiDockNode* root_node = DockNodeGetRootNode(node);
        if (root_node->OnlyNodeWithWindows != node || root_node->CentralNode != NULL)
            if (undock_floating_node || root_node->IsDockSpace())
                can_undock_node = true;
    }

    const bool clicked = IsMouseClicked(0);
    const bool dragging = IsMouseDragging(0, g.IO.MouseDragThreshold * 1.70f);
    if (can_undock_node && dragging)
    {
        DockContextQueueUndockNode(&g, node);
        g.ActiveIdClickOffset = g.IO.MouseClickedPos[0] - node->Pos;
    }
    else if (!can_undock_node && (clicked || dragging) && g.MovingWindow != window)
    {
        StartMouseMovingWindow(window);
        g.ActiveIdClickOffset = g.IO.MouseClickedPos[0] - window->RootWindow->Pos;
    }
}